

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExclusiveTermAppender.h
# Opt level: O0

int32_t __thiscall
aeron::concurrent::logbuffer::ExclusiveTermAppender::appendFragmentedMessage
          (ExclusiveTermAppender *this,int32_t termId,int32_t termOffset,HeaderWriter *header,
          AtomicBuffer *srcBuffer,index_t srcOffset,index_t length,index_t maxPayloadLength,
          on_reserved_value_supplier_t *reservedValueSupplier)

{
  int length_00;
  uint value;
  int iVar1;
  int *piVar2;
  long v;
  int local_74;
  int64_t reservedValue;
  index_t alignedLength;
  index_t frameLength;
  index_t bytesToWrite;
  int32_t offset;
  index_t remaining;
  index_t iStack_40;
  uint8_t flags;
  int32_t resultingOffset;
  int32_t termLength;
  index_t requiredLength;
  index_t lastFrameLength;
  index_t remainingPayload;
  int numMaxPayloads;
  index_t srcOffset_local;
  AtomicBuffer *srcBuffer_local;
  HeaderWriter *header_local;
  int32_t termOffset_local;
  int32_t termId_local;
  ExclusiveTermAppender *this_local;
  
  lastFrameLength = length / maxPayloadLength;
  requiredLength = length % maxPayloadLength;
  remainingPayload = srcOffset;
  _numMaxPayloads = srcBuffer;
  srcBuffer_local = (AtomicBuffer *)header;
  header_local._0_4_ = termOffset;
  header_local._4_4_ = termId;
  _termOffset_local = this;
  if (requiredLength < 1) {
    local_74 = 0;
  }
  else {
    local_74 = util::BitUtil::align<int>(requiredLength + 0x20,0x20);
  }
  termLength = local_74;
  resultingOffset = lastFrameLength * (maxPayloadLength + 0x20) + local_74;
  iStack_40 = AtomicBuffer::capacity(this->m_termBuffer);
  remaining = (int32_t)header_local + resultingOffset;
  putRawTailOrdered(this,(long)header_local._4_4_,remaining);
  if (iStack_40 < remaining) {
    remaining = handleEndOfLogCondition
                          (this->m_termBuffer,header_local._4_4_,(int32_t)header_local,
                           (HeaderWriter *)srcBuffer_local,iStack_40);
  }
  else {
    offset._3_1_ = 0x80;
    bytesToWrite = length;
    frameLength = (int32_t)header_local;
    do {
      piVar2 = std::min<int>(&bytesToWrite,&maxPayloadLength);
      length_00 = *piVar2;
      value = length_00 + 0x20;
      iVar1 = util::BitUtil::align<int>(value,0x20);
      HeaderWriter::write((HeaderWriter *)srcBuffer_local,(int)this->m_termBuffer,
                          (void *)(ulong)(uint)frameLength,(ulong)value);
      AtomicBuffer::putBytes
                (this->m_termBuffer,frameLength + 0x20,_numMaxPayloads,
                 remainingPayload + (length - bytesToWrite),length_00);
      if (bytesToWrite <= maxPayloadLength) {
        offset._3_1_ = offset._3_1_ | 0x40;
      }
      FrameDescriptor::frameFlags(this->m_termBuffer,frameLength,offset._3_1_);
      v = std::function<long_(aeron::concurrent::AtomicBuffer_&,_int,_int)>::operator()
                    (reservedValueSupplier,this->m_termBuffer,frameLength,value);
      AtomicBuffer::putInt64(this->m_termBuffer,frameLength + 0x18,v);
      FrameDescriptor::frameLengthOrdered(this->m_termBuffer,frameLength,value);
      offset._3_1_ = 0;
      frameLength = iVar1 + frameLength;
      bytesToWrite = bytesToWrite - length_00;
    } while (0 < bytesToWrite);
  }
  return remaining;
}

Assistant:

std::int32_t appendFragmentedMessage(
        std::int32_t termId,
        std::int32_t termOffset,
        const HeaderWriter& header,
        const AtomicBuffer& srcBuffer,
        util::index_t srcOffset,
        util::index_t length,
        util::index_t maxPayloadLength,
        const on_reserved_value_supplier_t& reservedValueSupplier)
    {
        const int numMaxPayloads = length / maxPayloadLength;
        const util::index_t remainingPayload = length % maxPayloadLength;
        const util::index_t lastFrameLength = (remainingPayload > 0) ?
            util::BitUtil::align(remainingPayload + DataFrameHeader::LENGTH, FrameDescriptor::FRAME_ALIGNMENT) : 0;
        const util::index_t requiredLength =
            (numMaxPayloads * (maxPayloadLength + DataFrameHeader::LENGTH)) + lastFrameLength;

        const std::int32_t termLength = m_termBuffer.capacity();

        std::int32_t resultingOffset = termOffset + requiredLength;
        putRawTailOrdered(termId, resultingOffset);

        if (resultingOffset > termLength)
        {
            resultingOffset = handleEndOfLogCondition(m_termBuffer, termId, termOffset, header, termLength);
        }
        else
        {
            std::uint8_t flags = FrameDescriptor::BEGIN_FRAG;
            util::index_t remaining = length;
            std::int32_t offset = static_cast<std::int32_t>(termOffset);

            do
            {
                const util::index_t bytesToWrite = std::min(remaining, maxPayloadLength);
                const util::index_t frameLength = bytesToWrite + DataFrameHeader::LENGTH;
                const util::index_t alignedLength = util::BitUtil::align(frameLength, FrameDescriptor::FRAME_ALIGNMENT);

                header.write(m_termBuffer, offset, frameLength, termId);
                m_termBuffer.putBytes(
                    offset + DataFrameHeader::LENGTH,
                    srcBuffer,
                    srcOffset + (length - remaining),
                    bytesToWrite);

                if (remaining <= maxPayloadLength)
                {
                    flags |= FrameDescriptor::END_FRAG;
                }

                FrameDescriptor::frameFlags(m_termBuffer, offset, flags);

                const std::int64_t reservedValue = reservedValueSupplier(m_termBuffer, offset, frameLength);
                m_termBuffer.putInt64(offset + DataFrameHeader::RESERVED_VALUE_FIELD_OFFSET, reservedValue);

                FrameDescriptor::frameLengthOrdered(m_termBuffer, offset, frameLength);

                flags = 0;
                offset += alignedLength;
                remaining -= bytesToWrite;
            }
            while (remaining > 0);
        }

        return resultingOffset;
    }